

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O0

void PrintOutput(void *arkode_mem,sunrealtype t)

{
  undefined4 uVar1;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sunrealtype hu;
  int flag;
  long nni;
  long nfi;
  long nfe;
  long nst;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_XMM0_Qa;
  local_8 = in_RDI;
  uVar1 = ARKodeGetNumSteps(in_RDI,&local_18);
  check_flag((void *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc);
  uVar1 = ARKStepGetNumRhsEvals(local_8,&local_20,&local_28);
  check_flag((void *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc);
  uVar1 = ARKodeGetNumNonlinSolvIters(local_8,&local_30);
  check_flag((void *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc);
  uVar1 = ARKodeGetLastStep(local_8,&stack0xffffffffffffffc0);
  check_flag((void *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc);
  printf("t = %10.2e  nst = %ld  nfe = %ld  nfi = %ld  nni = %ld",local_10,local_18,local_20,
         local_28,local_30);
  printf("  hu = %11.2e\n\n",in_stack_ffffffffffffffc0);
  return;
}

Assistant:

static void PrintOutput(void* arkode_mem, sunrealtype t)
{
  long int nst, nfe, nfi, nni;
  int flag;
  sunrealtype hu;

  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetLastStep(arkode_mem, &hu);
  check_flag(&flag, "ARKodeGetLastStep", 1);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("t = %10.2Le  nst = %ld  nfe = %ld  nfi = %ld  nni = %ld", t, nst, nfe,
         nfi, nni);
  printf("  hu = %11.2Le\n\n", hu);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("t = %10.2e  nst = %ld  nfe = %ld  nfi = %ld  nni = %ld", t, nst, nfe,
         nfi, nni);
  printf("  hu = %11.2e\n\n", hu);
#else
  printf("t = %10.2e  nst = %ld  nfe = %ld  nfi = %ld  nni = %ld", t, nst, nfe,
         nfi, nni);
  printf("  hu = %11.2e\n\n", hu);
#endif
}